

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffphtb(fitsfile *fptr,LONGLONG naxis1,LONGLONG naxis2,int tfields,char **ttype,long *tbcol,
          char **tform,char **tunit,char *extnmx,int *status)

{
  size_t sVar1;
  bool bVar2;
  int local_16c;
  char local_168 [8];
  char extnm [71];
  char local_118 [8];
  char comm [73];
  char name [75];
  char tfmt [30];
  long rowlen;
  int gotmem;
  int ncols;
  int ii;
  long *tbcol_local;
  char **ttype_local;
  int tfields_local;
  LONGLONG naxis2_local;
  LONGLONG naxis1_local;
  fitsfile *fptr_local;
  
  bVar2 = false;
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (*status < 1) {
    if (fptr->Fptr->headend == fptr->Fptr->headstart[fptr->Fptr->curhdu]) {
      if (naxis1 < 0) {
        *status = 0xd9;
        fptr_local._4_4_ = 0xd9;
      }
      else if (naxis2 < 0) {
        *status = 0xda;
        fptr_local._4_4_ = 0xda;
      }
      else if ((tfields < 0) || (999 < tfields)) {
        *status = 0xd8;
        fptr_local._4_4_ = 0xd8;
      }
      else {
        local_168[0] = '\0';
        if (extnmx != (char *)0x0) {
          strncat(local_168,extnmx,0x46);
        }
        unique0x100005a4 = naxis1;
        if (((tbcol == (long *)0x0) || (*tbcol == 0)) ||
           ((_ncols = tbcol, naxis1 == 0 && (tfields != 0)))) {
          local_16c = tfields;
          if (tfields < 5) {
            local_16c = 5;
          }
          _ncols = (long *)calloc((long)local_16c,8);
          bVar2 = _ncols != (long *)0x0;
          if (bVar2) {
            ffgabc(tfields,tform,1,(long *)(tfmt + 0x18),_ncols,status);
          }
        }
        ffpkys(fptr,"XTENSION","TABLE","ASCII table extension",status);
        ffpkyj(fptr,"BITPIX",8,"8-bit ASCII characters",status);
        ffpkyj(fptr,"NAXIS",2,"2-dimensional ASCII table",status);
        ffpkyj(fptr,"NAXIS1",stack0xffffffffffffffa8,"width of table in characters",status);
        ffpkyj(fptr,"NAXIS2",naxis2,"number of rows in table",status);
        ffpkyj(fptr,"PCOUNT",0,"no group parameters (required keyword)",status);
        ffpkyj(fptr,"GCOUNT",1,"one data group (required keyword)",status);
        ffpkyj(fptr,"TFIELDS",(long)tfields,"number of fields in each row",status);
        for (gotmem = 0; gotmem < tfields; gotmem = gotmem + 1) {
          if (*ttype[gotmem] != '\0') {
            snprintf(local_118,0x49,"label for field %3d",(ulong)(gotmem + 1));
            ffkeyn("TTYPE",gotmem + 1,comm + 0x48,status);
            ffpkys(fptr,comm + 0x48,ttype[gotmem],local_118,status);
          }
          if ((_ncols[gotmem] < 1) || (stack0xffffffffffffffa8 < _ncols[gotmem])) {
            *status = 0xea;
          }
          snprintf(local_118,0x49,"beginning column of field %3d",(ulong)(gotmem + 1));
          ffkeyn("TBCOL",gotmem + 1,comm + 0x48,status);
          ffpkyj(fptr,comm + 0x48,_ncols[gotmem],local_118,status);
          sVar1 = strlen(tform[gotmem]);
          if (0x1d < sVar1) {
            ffpmsg("Error: ASCII table TFORM code is too long (ffphtb)");
            *status = 0x105;
            break;
          }
          strcpy(name + 0x48,tform[gotmem]);
          ffupch(name + 0x48);
          ffkeyn("TFORM",gotmem + 1,comm + 0x48,status);
          ffpkys(fptr,comm + 0x48,name + 0x48,"Fortran-77 format of field",status);
          if (((tunit != (char **)0x0) && (tunit[gotmem] != (char *)0x0)) &&
             (*tunit[gotmem] != '\0')) {
            ffkeyn("TUNIT",gotmem + 1,comm + 0x48,status);
            ffpkys(fptr,comm + 0x48,tunit[gotmem],"physical unit of field",status);
          }
          if (0 < *status) break;
        }
        if (local_168[0] != '\0') {
          ffpkys(fptr,"EXTNAME",local_168,"name of this ASCII table extension",status);
        }
        if (0 < *status) {
          ffpmsg("Failed to write ASCII table header keywords (ffphtb)");
        }
        if (bVar2) {
          free(_ncols);
        }
        fptr_local._4_4_ = *status;
      }
    }
    else {
      *status = 0xc9;
      fptr_local._4_4_ = 0xc9;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffphtb(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis1,     /* I - width of row in the table                */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           long *tbcol,     /* I - byte offset in row to each column        */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,   /* I - value of EXTNAME keyword, if any         */
           int *status)     /* IO - error status                            */
/*
  Put required Header keywords into the ASCII TaBle:
*/
{
    int ii, ncols, gotmem = 0;
    long rowlen; /* must be 'long' because it is passed to ffgabc */
    char tfmt[30], name[FLEN_KEYWORD], comm[FLEN_COMMENT], extnm[FLEN_VALUE];

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (*status > 0)
        return(*status);
    else if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);
    else if (naxis1 < 0)
        return(*status = NEG_WIDTH);
    else if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (tfields < 0 || tfields > 999)
        return(*status = BAD_TFIELDS);
    
    extnm[0] = '\0';
    if (extnmx)
        strncat(extnm, extnmx, FLEN_VALUE-1);

    rowlen = (long) naxis1;

    if (!tbcol || !tbcol[0] || (!naxis1 && tfields)) /* spacing not defined? */
    {
      /* allocate mem for tbcol; malloc can have problems allocating small */
      /* arrays, so allocate at least 20 bytes */

      ncols = maxvalue(5, tfields);
      tbcol = (long *) calloc(ncols, sizeof(long));

      if (tbcol)
      {
        gotmem = 1;

        /* calculate width of a row and starting position of each column. */
        /* Each column will be separated by 1 blank space */
        ffgabc(tfields, tform, 1, &rowlen, tbcol, status);
      }
    }
    ffpkys(fptr, "XTENSION", "TABLE", "ASCII table extension", status);
    ffpkyj(fptr, "BITPIX", 8, "8-bit ASCII characters", status);
    ffpkyj(fptr, "NAXIS", 2, "2-dimensional ASCII table", status);
    ffpkyj(fptr, "NAXIS1", rowlen, "width of table in characters", status);
    ffpkyj(fptr, "NAXIS2", naxis2, "number of rows in table", status);
    ffpkyj(fptr, "PCOUNT", 0, "no group parameters (required keyword)", status);
    ffpkyj(fptr, "GCOUNT", 1, "one data group (required keyword)", status);
    ffpkyj(fptr, "TFIELDS", tfields, "number of fields in each row", status);

    for (ii = 0; ii < tfields; ii++) /* loop over every column */
    {
        if ( *(ttype[ii]) )  /* optional TTYPEn keyword */
        {
          snprintf(comm, FLEN_COMMENT,"label for field %3d", ii + 1);
          ffkeyn("TTYPE", ii + 1, name, status);
          ffpkys(fptr, name, ttype[ii], comm, status);
        }

        if (tbcol[ii] < 1 || tbcol[ii] > rowlen)
           *status = BAD_TBCOL;

        snprintf(comm, FLEN_COMMENT,"beginning column of field %3d", ii + 1);
        ffkeyn("TBCOL", ii + 1, name, status);
        ffpkyj(fptr, name, tbcol[ii], comm, status);

        if (strlen(tform[ii]) > 29)
        {
          ffpmsg("Error: ASCII table TFORM code is too long (ffphtb)");
          *status = BAD_TFORM;
          break;
        }
        strcpy(tfmt, tform[ii]);  /* required TFORMn keyword */
        ffupch(tfmt);
        ffkeyn("TFORM", ii + 1, name, status);
        ffpkys(fptr, name, tfmt, "Fortran-77 format of field", status);

        if (tunit)
        {
         if (tunit[ii] && *(tunit[ii]) )  /* optional TUNITn keyword */
         {
          ffkeyn("TUNIT", ii + 1, name, status);
          ffpkys(fptr, name, tunit[ii], "physical unit of field", status) ;
         }
        }

        if (*status > 0)
            break;       /* abort loop on error */
    }

    if (extnm[0])       /* optional EXTNAME keyword */
        ffpkys(fptr, "EXTNAME", extnm,
               "name of this ASCII table extension", status);

    if (*status > 0)
        ffpmsg("Failed to write ASCII table header keywords (ffphtb)");

    if (gotmem)
        free(tbcol); 

    return(*status);
}